

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluatePreModify(ExpressionEvalContext *ctx,ExprPreModify *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  SynBase *pSVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  ExprBase *pEVar9;
  ExprBase *unevaluatedRhs;
  undefined4 extraout_var_00;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar8 = Evaluate(ctx,expression->value);
      if (pEVar8 != (ExprBase *)0x0) {
        pEVar9 = CreateLoad(ctx,pEVar8);
        if (pEVar9 != (ExprBase *)0x0) {
          pSVar3 = (expression->super_ExprBase).source;
          pAVar2 = ctx->ctx->allocator;
          iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          unevaluatedRhs = (ExprBase *)CONCAT44(extraout_var_00,iVar7);
          pSVar5 = (expression->super_ExprBase).source;
          pTVar4 = pEVar9->type;
          unevaluatedRhs->typeID = 6;
          unevaluatedRhs->source = pSVar5;
          unevaluatedRhs->type = pTVar4;
          unevaluatedRhs->next = (ExprBase *)0x0;
          unevaluatedRhs->listed = false;
          unevaluatedRhs->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223510;
          unevaluatedRhs[1]._vptr_ExprBase = (_func_int **)0x1;
          pEVar9 = CreateBinaryOp(ctx,pSVar3,pEVar9,unevaluatedRhs,
                                  SYN_BINARY_OP_SUB - expression->isIncrement);
          if (pEVar9 != (ExprBase *)0x0) {
            bVar6 = CreateStore(ctx,pEVar8,pEVar9);
            if (bVar6) {
              pEVar8 = CheckType(&expression->super_ExprBase,pEVar9);
              return pEVar8;
            }
          }
        }
      }
      pEVar8 = (ExprBase *)0x0;
    }
    else {
      pEVar8 = (ExprBase *)0x0;
      Report(ctx,"ERROR: instruction limit reached");
    }
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar7 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar8->typeID = 2;
    pEVar8->source = pSVar3;
    pEVar8->type = pTVar4;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
  }
  return pEVar8;
}

Assistant:

ExprBase* EvaluatePreModify(ExpressionEvalContext &ctx, ExprPreModify *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *ptr = Evaluate(ctx, expression->value);

	if(!ptr)
		return NULL;

	ExprBase *value = CreateLoad(ctx, ptr);

	if(!value)
		return NULL;

	ExprBase *modified = CreateBinaryOp(ctx, expression->source, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, value->type, 1), expression->isIncrement ? SYN_BINARY_OP_ADD : SYN_BINARY_OP_SUB);

	if(!modified)
		return NULL;

	if(!CreateStore(ctx, ptr, modified))
		return NULL;

	return CheckType(expression, modified);
}